

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::anon_unknown_17::MthdSyfmSrcPos::adjust_orig_mthd(MthdSyfmSrcPos *this)

{
  result_type rVar1;
  MthdSyfmSrcPos *this_local;
  
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.rnd);
  if ((rVar1 & 1) == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.xy_misc_4[0] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.xy_misc_4[0] & 0xffffff0f
         | 0xf0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.ctx_user =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.ctx_user & 0xffff1fff |
         ((this->super_SingleMthdTest).super_MthdTest.subc & 7) << 0xd;
  }
  else if ((rVar1 & 1) == 1) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.cliprect_ctrl =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.cliprect_ctrl & 0xfffffeff
         | 0x100;
  }
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.rnd);
  if ((rVar1 & 1) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid[0] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid[0] | 0x100033;
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid[0] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid[0] | 0xf00;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid[0] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid[0] | 0x3f000;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid[0] =
         1 << ((byte)rVar1 & 0x1f) ^
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid[0];
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		// XXX: disable this some day and test the actual DMA
		switch (rnd() % 2) {
			case 0:
				insrt(orig.xy_misc_4[0], 4, 4, 0xf);
				insrt(orig.ctx_user, 13, 3, subc);
				break;
			case 1:
				insrt(orig.cliprect_ctrl, 8, 1, 1);
				break;
		}
		if (rnd() & 1) {
			orig.valid[0] |= 0x100033;
			if (rnd() & 1)
				orig.valid[0] |= 0x000f00;
			if (rnd() & 1)
				orig.valid[0] |= 0x03f000;
			orig.valid[0] ^= 1 << (rnd() & 0x1f);
		}
	}